

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.hpp
# Opt level: O3

anon_class_96_2_1b0831f6 *
DataSuppliment<std::tuple<unsigned_long_long,bool,std::array<bool,8ul>,Game::GameBoard>,std::__cxx11::string(*)(std::tuple<unsigned_long_long,bool,std::array<bool,8ul>,Game::GameBoard>)>
          (anon_class_96_2_1b0831f6 *__return_storage_ptr__,
          tuple<unsigned_long_long,_bool,_std::array<bool,_8UL>,_Game::GameBoard> *needed_data,
          _func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_tuple<unsigned_long_long,_bool,_std::array<bool,_8UL>,_Game::GameBoard>
          *f)

{
  _Tuple_impl<2UL,_std::array<bool,_8UL>,_Game::GameBoard> *p_Var1;
  anon_class_96_2_1b0831f6 lambda_f_to_return;
  vector<Game::tile_t,_std::allocator<Game::tile_t>_> local_80;
  unsigned_long local_68;
  undefined8 local_60;
  ull uStack_58;
  ull local_50;
  longlong lStack_48;
  undefined8 local_40;
  bool local_38;
  unsigned_long_long local_30;
  _func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_tuple<unsigned_long_long,_bool,_std::array<bool,_8UL>,_Game::GameBoard>
  *local_28;
  
  std::vector<Game::tile_t,_std::allocator<Game::tile_t>_>::vector
            (&local_80,(vector<Game::tile_t,_std::allocator<Game::tile_t>_> *)needed_data);
  local_68 = ((_Head_base<0UL,_unsigned_long,_false> *)
             ((long)&(needed_data->
                     super__Tuple_impl<0UL,_unsigned_long_long,_bool,_std::array<bool,_8UL>,_Game::GameBoard>
                     ).super__Tuple_impl<1UL,_bool,_std::array<bool,_8UL>,_Game::GameBoard>.
                     super__Tuple_impl<2UL,_std::array<bool,_8UL>,_Game::GameBoard>.
                     super__Tuple_impl<3UL,_Game::GameBoard>.
                     super__Head_base<3UL,_Game::GameBoard,_false>._M_head_impl.gbda + 0x18))->
             _M_head_impl;
  p_Var1 = &(needed_data->
            super__Tuple_impl<0UL,_unsigned_long_long,_bool,_std::array<bool,_8UL>,_Game::GameBoard>
            ).super__Tuple_impl<1UL,_bool,_std::array<bool,_8UL>,_Game::GameBoard>.
            super__Tuple_impl<2UL,_std::array<bool,_8UL>,_Game::GameBoard>;
  local_60._0_1_ =
       (p_Var1->super__Tuple_impl<3UL,_Game::GameBoard>).
       super__Head_base<3UL,_Game::GameBoard,_false>._M_head_impl.win;
  local_60._1_1_ =
       (p_Var1->super__Tuple_impl<3UL,_Game::GameBoard>).
       super__Head_base<3UL,_Game::GameBoard,_false>._M_head_impl.moved;
  local_60._2_6_ =
       *(undefined6 *)
        &(p_Var1->super__Tuple_impl<3UL,_Game::GameBoard>).
         super__Head_base<3UL,_Game::GameBoard,_false>._M_head_impl.field_0x22;
  uStack_58 = (needed_data->
              super__Tuple_impl<0UL,_unsigned_long_long,_bool,_std::array<bool,_8UL>,_Game::GameBoard>
              ).super__Tuple_impl<1UL,_bool,_std::array<bool,_8UL>,_Game::GameBoard>.
              super__Tuple_impl<2UL,_std::array<bool,_8UL>,_Game::GameBoard>.
              super__Tuple_impl<3UL,_Game::GameBoard>.super__Head_base<3UL,_Game::GameBoard,_false>.
              _M_head_impl.score;
  local_50 = (needed_data->
             super__Tuple_impl<0UL,_unsigned_long_long,_bool,_std::array<bool,_8UL>,_Game::GameBoard>
             ).super__Tuple_impl<1UL,_bool,_std::array<bool,_8UL>,_Game::GameBoard>.
             super__Tuple_impl<2UL,_std::array<bool,_8UL>,_Game::GameBoard>.
             super__Tuple_impl<3UL,_Game::GameBoard>.super__Head_base<3UL,_Game::GameBoard,_false>.
             _M_head_impl.largestTile;
  lStack_48 = (needed_data->
              super__Tuple_impl<0UL,_unsigned_long_long,_bool,_std::array<bool,_8UL>,_Game::GameBoard>
              ).super__Tuple_impl<1UL,_bool,_std::array<bool,_8UL>,_Game::GameBoard>.
              super__Tuple_impl<2UL,_std::array<bool,_8UL>,_Game::GameBoard>.
              super__Tuple_impl<3UL,_Game::GameBoard>.super__Head_base<3UL,_Game::GameBoard,_false>.
              _M_head_impl.moveCount;
  local_40 = *(undefined8 *)
              (needed_data->
              super__Tuple_impl<0UL,_unsigned_long_long,_bool,_std::array<bool,_8UL>,_Game::GameBoard>
              ).super__Tuple_impl<1UL,_bool,_std::array<bool,_8UL>,_Game::GameBoard>.
              super__Tuple_impl<2UL,_std::array<bool,_8UL>,_Game::GameBoard>.
              super__Head_base<2UL,_std::array<bool,_8UL>,_false>._M_head_impl._M_elems;
  local_38 = (needed_data->
             super__Tuple_impl<0UL,_unsigned_long_long,_bool,_std::array<bool,_8UL>,_Game::GameBoard>
             ).super__Tuple_impl<1UL,_bool,_std::array<bool,_8UL>,_Game::GameBoard>.
             super__Head_base<1UL,_bool,_false>._M_head_impl;
  local_30 = (needed_data->
             super__Tuple_impl<0UL,_unsigned_long_long,_bool,_std::array<bool,_8UL>,_Game::GameBoard>
             ).super__Head_base<0UL,_unsigned_long_long,_false>._M_head_impl;
  local_28 = f;
  std::vector<Game::tile_t,_std::allocator<Game::tile_t>_>::vector
            ((vector<Game::tile_t,_std::allocator<Game::tile_t>_> *)__return_storage_ptr__,&local_80
            );
  ((_Head_base<0UL,_unsigned_long,_false> *)
  ((long)&(__return_storage_ptr__->needed_data).
          super__Tuple_impl<0UL,_unsigned_long_long,_bool,_std::array<bool,_8UL>,_Game::GameBoard>.
          super__Tuple_impl<1UL,_bool,_std::array<bool,_8UL>,_Game::GameBoard>.
          super__Tuple_impl<2UL,_std::array<bool,_8UL>,_Game::GameBoard>.
          super__Tuple_impl<3UL,_Game::GameBoard>.super__Head_base<3UL,_Game::GameBoard,_false>.
          _M_head_impl + 0x18))->_M_head_impl = local_68;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->needed_data).
           super__Tuple_impl<0UL,_unsigned_long_long,_bool,_std::array<bool,_8UL>,_Game::GameBoard>.
           super__Tuple_impl<1UL,_bool,_std::array<bool,_8UL>,_Game::GameBoard>.
           super__Tuple_impl<2UL,_std::array<bool,_8UL>,_Game::GameBoard>.
           super__Tuple_impl<3UL,_Game::GameBoard>.super__Head_base<3UL,_Game::GameBoard,_false>.
           _M_head_impl + 0x20) = local_60;
  *(ull *)((long)&(__return_storage_ptr__->needed_data).
                  super__Tuple_impl<0UL,_unsigned_long_long,_bool,_std::array<bool,_8UL>,_Game::GameBoard>
                  .super__Tuple_impl<1UL,_bool,_std::array<bool,_8UL>,_Game::GameBoard>.
                  super__Tuple_impl<2UL,_std::array<bool,_8UL>,_Game::GameBoard>.
                  super__Tuple_impl<3UL,_Game::GameBoard>.
                  super__Head_base<3UL,_Game::GameBoard,_false>._M_head_impl + 0x28) = uStack_58;
  *(ull *)((long)&(__return_storage_ptr__->needed_data).
                  super__Tuple_impl<0UL,_unsigned_long_long,_bool,_std::array<bool,_8UL>,_Game::GameBoard>
                  .super__Tuple_impl<1UL,_bool,_std::array<bool,_8UL>,_Game::GameBoard>.
                  super__Tuple_impl<2UL,_std::array<bool,_8UL>,_Game::GameBoard>.
                  super__Tuple_impl<3UL,_Game::GameBoard>.
                  super__Head_base<3UL,_Game::GameBoard,_false>._M_head_impl + 0x30) = local_50;
  *(longlong *)
   ((long)&(__return_storage_ptr__->needed_data).
           super__Tuple_impl<0UL,_unsigned_long_long,_bool,_std::array<bool,_8UL>,_Game::GameBoard>.
           super__Tuple_impl<1UL,_bool,_std::array<bool,_8UL>,_Game::GameBoard>.
           super__Tuple_impl<2UL,_std::array<bool,_8UL>,_Game::GameBoard>.
           super__Tuple_impl<3UL,_Game::GameBoard>.super__Head_base<3UL,_Game::GameBoard,_false>.
           _M_head_impl + 0x38) = lStack_48;
  *(undefined8 *)
   (__return_storage_ptr__->needed_data).
   super__Tuple_impl<0UL,_unsigned_long_long,_bool,_std::array<bool,_8UL>,_Game::GameBoard>.
   super__Tuple_impl<1UL,_bool,_std::array<bool,_8UL>,_Game::GameBoard>.
   super__Tuple_impl<2UL,_std::array<bool,_8UL>,_Game::GameBoard>.
   super__Head_base<2UL,_std::array<bool,_8UL>,_false>._M_head_impl._M_elems = local_40;
  (__return_storage_ptr__->needed_data).
  super__Tuple_impl<0UL,_unsigned_long_long,_bool,_std::array<bool,_8UL>,_Game::GameBoard>.
  super__Tuple_impl<1UL,_bool,_std::array<bool,_8UL>,_Game::GameBoard>.
  super__Head_base<1UL,_bool,_false>._M_head_impl = local_38;
  (__return_storage_ptr__->needed_data).
  super__Tuple_impl<0UL,_unsigned_long_long,_bool,_std::array<bool,_8UL>,_Game::GameBoard>.
  super__Head_base<0UL,_unsigned_long_long,_false>._M_head_impl = local_30;
  __return_storage_ptr__->f = local_28;
  if (local_80.super__Vector_base<Game::tile_t,_std::allocator<Game::tile_t>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_80.super__Vector_base<Game::tile_t,_std::allocator<Game::tile_t>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_80.super__Vector_base<Game::tile_t,_std::allocator<Game::tile_t>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.super__Vector_base<Game::tile_t,_std::allocator<Game::tile_t>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

auto DataSuppliment(suppliment_t needed_data, function_t f) {
  using dsit_t = DataSupplimentInternalType<suppliment_t>;
  const auto lambda_f_to_return = [=]() {
    const dsit_t depinject_func = dsit_t{needed_data};
    return depinject_func(f);
  };
  return lambda_f_to_return;
}